

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testUserEncoding(void)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int local_4c;
  int local_48;
  int ret;
  int i;
  int k;
  int totalSize;
  int endSize;
  int textSize;
  int startSize;
  xmlChar *text;
  char *buf;
  char *end;
  char *start;
  xmlDocPtr doc;
  
  sVar2 = strlen("<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?><d>");
  sVar3 = strlen(anon_var_dwarf_39a + 1);
  iVar1 = (int)sVar2 + 100000 + (int)sVar3;
  ret = 0;
  local_4c = 1;
  lVar4 = (*_xmlMalloc)((long)(iVar1 * 2));
  for (local_48 = 0; "<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?><d>"[local_48] != '\0';
      local_48 = local_48 + 1) {
    iVar6 = ret + 1;
    *(char *)(lVar4 + ret) = "<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?><d>"[local_48];
    ret = ret + 2;
    *(undefined1 *)(lVar4 + iVar6) = 0;
  }
  for (local_48 = 0; local_48 < 100000; local_48 = local_48 + 1) {
    iVar6 = ret + 1;
    *(undefined1 *)(lVar4 + ret) = 0x78;
    ret = ret + 2;
    *(undefined1 *)(lVar4 + iVar6) = 0;
  }
  local_48 = 0;
  while (anon_var_dwarf_39a[(long)local_48 + 1] != '\0') {
    iVar6 = ret + 1;
    *(char *)(lVar4 + ret) = anon_var_dwarf_39a[(long)local_48 + 1];
    ret = ret + 2;
    *(undefined1 *)(lVar4 + iVar6) = 0;
    local_48 = local_48 + 1;
  }
  lVar5 = xmlReadMemory(lVar4,iVar1 * 2,0,"UTF-16LE",0);
  if (lVar5 == 0) {
    fprintf(_stderr,"failed to parse document\n");
  }
  else {
    for (local_48 = 0; local_48 < 100000; local_48 = local_48 + 1) {
      if (*(char *)(*(long *)(*(long *)(*(long *)(lVar5 + 0x18) + 0x18) + 0x50) + (long)local_48) !=
          'x') {
        fprintf(_stderr,"text node has wrong content at offset %d\n",(ulong)(uint)ret);
        goto LAB_00102ced;
      }
    }
    local_4c = 0;
  }
LAB_00102ced:
  xmlFreeDoc(lVar5);
  (*_xmlFree)(lVar4);
  return local_4c;
}

Assistant:

static int
testUserEncoding(void) {
    /*
     * Create a document encoded as UTF-16LE with an ISO-8859-1 encoding
     * declaration, then parse it with xmlReadMemory and the encoding
     * argument set to UTF-16LE.
     */
    xmlDocPtr doc = NULL;
    const char *start = "<?xml version='1.0' encoding='ISO-8859-1'?><d>";
    const char *end = "</d>";
    char *buf = NULL;
    xmlChar *text;
    int startSize = strlen(start);
    int textSize = 100000; /* Make sure to exceed internal buffer sizes. */
    int endSize = strlen(end);
    int totalSize = startSize + textSize + endSize;
    int k = 0;
    int i;
    int ret = 1;

    buf = xmlMalloc(2 * totalSize);
    for (i = 0; start[i] != 0; i++) {
        buf[k++] = start[i];
        buf[k++] = 0;
    }
    for (i = 0; i < textSize; i++) {
        buf[k++] = 'x';
        buf[k++] = 0;
    }
    for (i = 0; end[i] != 0; i++) {
        buf[k++] = end[i];
        buf[k++] = 0;
    }

    doc = xmlReadMemory(buf, 2 * totalSize, NULL, "UTF-16LE", 0);
    if (doc == NULL) {
        fprintf(stderr, "failed to parse document\n");
        goto error;
    }

    text = doc->children->children->content;
    for (i = 0; i < textSize; i++) {
        if (text[i] != 'x') {
            fprintf(stderr, "text node has wrong content at offset %d\n", k);
            goto error;
        }
    }

    ret = 0;

error:
    xmlFreeDoc(doc);
    xmlFree(buf);

    return ret;
}